

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ztrsv.c
# Opt level: O1

void ztrsv_(char *uplo,char *trans,char *diag,integer *n,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  doublecomplex *pdVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  double *pdVar21;
  doublecomplex *pdVar22;
  double *pdVar23;
  char cVar24;
  int iVar25;
  int iVar26;
  double *pdVar27;
  integer info;
  doublecomplex z__3;
  doublecomplex local_d8;
  int *local_c8;
  doublecomplex local_c0;
  int local_ac;
  doublecomplex local_a8;
  long local_98;
  uint *local_90;
  doublecomplex *local_88;
  double *local_80;
  long local_78;
  doublecomplex local_70;
  double *local_60;
  long local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  ulong local_38;
  
  local_ac = 0;
  cVar5 = *uplo;
  if ((cVar5 == 'L') || (cVar5 == 'U')) {
    if (((byte)*trans - 0x43 < 0x12) && ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) != 0)) {
      if ((*diag == 'N') || (*diag == 'U')) {
        iVar26 = *n;
        if (iVar26 < 0) {
          local_ac = 4;
        }
        else {
          iVar25 = 1;
          if (1 < iVar26) {
            iVar25 = iVar26;
          }
          if (*lda < iVar25) {
            local_ac = 6;
          }
          else if (*incx == 0) {
            local_ac = 8;
          }
        }
      }
      else {
        local_ac = 3;
      }
    }
    else {
      local_ac = 2;
    }
  }
  else {
    local_ac = 1;
  }
  if (local_ac == 0) {
    uVar7 = *n;
    uVar12 = (ulong)uVar7;
    if (uVar12 != 0) {
      cVar24 = *trans;
      cVar6 = *diag;
      iVar26 = *incx;
      iVar25 = uVar7 - 1;
      iVar19 = 1 - iVar26 * iVar25;
      if (0 < iVar26) {
        iVar19 = 1;
      }
      local_c8 = lda;
      local_90 = (uint *)n;
      local_88 = a;
      if (cVar24 == 'N') {
        if (cVar5 == 'U') {
          if (iVar26 == 1) {
            if (0 < (int)uVar7) {
              lVar18 = uVar12 * 0x10;
              pdVar17 = a + (uVar12 - 2);
              pdVar27 = &x[uVar12 - 2].i;
              do {
                lVar18 = lVar18 + -0x10;
                local_90 = (uint *)(uVar12 - 1);
                pdVar22 = x + (long)local_90;
                if ((((x[(long)local_90].r != 0.0) || (NAN(x[(long)local_90].r))) ||
                    (pdVar22->i != 0.0)) || (NAN(pdVar22->i))) {
                  if (cVar6 == 'N') {
                    z_div(&local_c0,pdVar22,a + (int)local_90 * (*local_c8 + 1));
                    pdVar22->r = local_c0.r;
                    pdVar22->i = local_c0.i;
                    a = local_88;
                  }
                  local_d8.r = pdVar22->r;
                  local_d8.i = pdVar22->i;
                  if (1 < (long)uVar12) {
                    iVar26 = *local_c8;
                    lVar13 = 0;
                    uVar15 = uVar12;
                    do {
                      dVar1 = *(double *)((long)&pdVar17->r + lVar13 + iVar26 * lVar18);
                      dVar2 = *(double *)((long)&pdVar17->i + lVar13 + iVar26 * lVar18);
                      local_a8.r = local_d8.r * dVar1 + dVar2 * -local_d8.i;
                      local_a8.i = dVar2 * local_d8.r + dVar1 * local_d8.i;
                      local_c0.r = *(double *)((long)pdVar27 + lVar13 + -8) - local_a8.r;
                      local_c0.i = *(double *)((long)pdVar27 + lVar13) - local_a8.i;
                      *(double *)((long)pdVar27 + lVar13 + -8) = local_c0.r;
                      *(double *)((long)pdVar27 + lVar13) = local_c0.i;
                      uVar15 = uVar15 - 1;
                      lVar13 = lVar13 + -0x10;
                    } while (1 < (long)uVar15);
                  }
                }
                pdVar17 = pdVar17 + -1;
                pdVar27 = pdVar27 + -2;
                bVar10 = 1 < (long)uVar12;
                uVar12 = (ulong)local_90;
              } while (bVar10);
            }
          }
          else if (0 < (int)uVar7) {
            iVar19 = iVar19 + iVar26 * (uVar7 - 1);
            pdVar17 = a + (uVar12 - 2);
            do {
              iVar26 = (int)uVar12;
              if (((x[(long)iVar19 + -1].r != 0.0) || (NAN(x[(long)iVar19 + -1].r))) ||
                 ((x[(long)iVar19 + -1].i != 0.0 || (NAN(x[(long)iVar19 + -1].i))))) {
                if (cVar6 == 'N') {
                  z_div(&local_c0,x + (long)iVar19 + -1,a + (*local_c8 + 1) * (iVar26 + -1));
                  x[(long)iVar19 + -1].r = local_c0.r;
                  x[(long)iVar19 + -1].i = local_c0.i;
                  a = local_88;
                }
                local_d8.r = x[(long)iVar19 + -1].r;
                local_d8.i = x[(long)iVar19 + -1].i;
                if (1 < iVar26) {
                  iVar8 = *incx;
                  iVar9 = *local_c8;
                  iVar14 = iVar19 - iVar8;
                  pdVar22 = pdVar17;
                  uVar15 = uVar12;
                  do {
                    local_a8.r = local_d8.r * pdVar22[(long)iVar25 * (long)iVar9].r +
                                 pdVar22[(long)iVar25 * (long)iVar9].i * -local_d8.i;
                    local_a8.i = pdVar22[(long)iVar25 * (long)iVar9].i * local_d8.r +
                                 pdVar22[(long)iVar25 * (long)iVar9].r * local_d8.i;
                    local_c0.r = x[(long)iVar14 + -1].r - local_a8.r;
                    local_c0.i = x[(long)iVar14 + -1].i - local_a8.i;
                    x[(long)iVar14 + -1].r = local_c0.r;
                    x[(long)iVar14 + -1].i = local_c0.i;
                    uVar15 = uVar15 - 1;
                    pdVar22 = pdVar22 + -1;
                    iVar14 = iVar14 - iVar8;
                  } while (1 < (long)uVar15);
                }
              }
              uVar12 = uVar12 - 1;
              iVar19 = iVar19 - *incx;
              iVar25 = iVar25 + -1;
              pdVar17 = pdVar17 + -1;
            } while (1 < iVar26);
          }
        }
        else if (iVar26 == 1) {
          if (0 < *n) {
            pdVar27 = &x[1].i;
            lVar18 = 0;
            uVar12 = 1;
            do {
              lVar13 = uVar12 - 1;
              pdVar17 = x + lVar13;
              if (((x[lVar13].r != 0.0) || (NAN(x[lVar13].r))) ||
                 ((pdVar17->i != 0.0 || (NAN(pdVar17->i))))) {
                if (cVar6 == 'N') {
                  z_div(&local_c0,pdVar17,a + (int)lVar13 * (*local_c8 + 1));
                  pdVar17->r = local_c0.r;
                  pdVar17->i = local_c0.i;
                  a = local_88;
                  n = (integer *)local_90;
                }
                local_d8.r = pdVar17->r;
                local_d8.i = pdVar17->i;
                if ((long)uVar12 < (long)*n) {
                  uVar15 = (ulong)(uint)*n;
                  lVar13 = ((long)*local_c8 + 1) * lVar18;
                  lVar16 = 0;
                  do {
                    dVar1 = *(double *)((long)&a[1].r + lVar16 + lVar13);
                    dVar2 = *(double *)((long)&a[1].i + lVar16 + lVar13);
                    local_a8.r = local_d8.r * dVar1 + dVar2 * -local_d8.i;
                    local_a8.i = dVar2 * local_d8.r + dVar1 * local_d8.i;
                    local_c0.r = *(double *)((long)pdVar27 + lVar16 + -8) - local_a8.r;
                    local_c0.i = *(double *)((long)pdVar27 + lVar16) - local_a8.i;
                    *(double *)((long)pdVar27 + lVar16 + -8) = local_c0.r;
                    *(double *)((long)pdVar27 + lVar16) = local_c0.i;
                    lVar16 = lVar16 + 0x10;
                    uVar15 = uVar15 - 1;
                  } while (uVar12 != uVar15);
                }
              }
              lVar18 = lVar18 + 0x10;
              pdVar27 = pdVar27 + 2;
              bVar10 = (long)uVar12 < (long)*n;
              uVar12 = uVar12 + 1;
            } while (bVar10);
          }
        }
        else if (0 < *n) {
          local_60 = &x[-1].i;
          pdVar27 = &a[1].i;
          uVar12 = 1;
          iVar26 = 0;
          do {
            local_98 = CONCAT44(local_98._4_4_,iVar19);
            lVar18 = (long)iVar19;
            iVar25 = (int)uVar12;
            if ((((x[lVar18 + -1].r != 0.0) || (NAN(x[lVar18 + -1].r))) || (x[lVar18 + -1].i != 0.0)
                ) || (NAN(x[lVar18 + -1].i))) {
              if (cVar6 == 'N') {
                z_div(&local_c0,x + lVar18 + -1,a + (*local_c8 + 1) * (iVar25 + -1));
                x[lVar18 + -1].r = local_c0.r;
                x[lVar18 + -1].i = local_c0.i;
                a = local_88;
                n = (integer *)local_90;
              }
              local_d8.r = x[lVar18 + -1].r;
              local_d8.i = x[lVar18 + -1].i;
              uVar15 = (ulong)(uint)*n;
              if (iVar25 < *n) {
                iVar19 = *incx;
                iVar8 = *local_c8;
                pdVar21 = local_60 + (lVar18 + iVar19) * 2;
                pdVar23 = pdVar27;
                do {
                  local_a8.r = local_d8.r * pdVar23[(long)iVar26 * (long)iVar8 * 2 + -1] +
                               pdVar23[(long)iVar26 * (long)iVar8 * 2] * -local_d8.i;
                  local_a8.i = pdVar23[(long)iVar26 * (long)iVar8 * 2] * local_d8.r +
                               pdVar23[(long)iVar26 * (long)iVar8 * 2 + -1] * local_d8.i;
                  local_c0.r = ((doublecomplex *)(pdVar21 + -1))->r - local_a8.r;
                  local_c0.i = *pdVar21 - local_a8.i;
                  ((doublecomplex *)(pdVar21 + -1))->r = local_c0.r;
                  *pdVar21 = local_c0.i;
                  pdVar21 = pdVar21 + (long)iVar19 * 2;
                  pdVar23 = pdVar23 + 2;
                  uVar15 = uVar15 - 1;
                } while (uVar12 != uVar15);
              }
            }
            iVar19 = (int)local_98 + *incx;
            uVar12 = uVar12 + 1;
            iVar26 = iVar26 + 1;
            pdVar27 = pdVar27 + 2;
          } while (iVar25 < *n);
        }
      }
      else {
        local_60 = (double *)CONCAT71(local_60._1_7_,cVar24);
        if (cVar5 == 'U') {
          if (iVar26 == 1) {
            if (0 < *n) {
              local_80 = &a->i;
              lVar18 = 0;
              uVar12 = 1;
              do {
                piVar11 = local_c8;
                lVar13 = uVar12 - 1;
                local_d8.r = x[lVar13].r;
                local_d8.i = x[lVar13].i;
                if (cVar24 == 'T') {
                  if (1 < uVar12) {
                    lVar16 = 0;
                    do {
                      dVar1 = *(double *)((long)local_80 + lVar16 + *local_c8 * lVar18 + -8);
                      dVar2 = *(double *)((long)local_80 + lVar16 + *local_c8 * lVar18);
                      dVar3 = *(double *)((long)&x->r + lVar16);
                      dVar4 = *(double *)((long)&x->i + lVar16);
                      local_a8.r = dVar1 * dVar3 - dVar4 * dVar2;
                      local_a8.i = dVar1 * dVar4 + dVar3 * dVar2;
                      local_d8.r = local_d8.r - local_a8.r;
                      local_d8.i = local_d8.i - local_a8.i;
                      lVar16 = lVar16 + 0x10;
                      local_c0.r = local_d8.r;
                      local_c0.i = local_d8.i;
                    } while (lVar18 != lVar16);
                  }
                  if (cVar6 == 'N') {
                    pdVar17 = a + (int)lVar13 * (*local_c8 + 1);
LAB_00113cdf:
                    z_div(&local_c0,&local_d8,pdVar17);
                    local_d8.r = local_c0.r;
                    local_d8.i = local_c0.i;
                    a = local_88;
                    n = (integer *)local_90;
                  }
                }
                else {
                  local_98 = lVar13;
                  if (1 < uVar12) {
                    lVar16 = 0;
                    do {
                      d_cnjg(&local_70,(doublecomplex *)((long)&a->r + lVar16 + *piVar11 * lVar18));
                      dVar1 = *(double *)((long)&x->r + lVar16);
                      dVar2 = *(double *)((long)&x->i + lVar16);
                      local_a8.r = local_70.r * dVar1 - dVar2 * local_70.i;
                      local_a8.i = local_70.r * dVar2 + dVar1 * local_70.i;
                      local_d8.r = local_d8.r - local_a8.r;
                      local_d8.i = local_d8.i - local_a8.i;
                      lVar16 = lVar16 + 0x10;
                      a = local_88;
                      local_c0.r = local_d8.r;
                      local_c0.i = local_d8.i;
                    } while (lVar18 != lVar16);
                  }
                  cVar24 = (char)local_60;
                  n = (integer *)local_90;
                  if (cVar6 == 'N') {
                    pdVar17 = &local_a8;
                    d_cnjg(pdVar17,a + (int)local_98 * (*local_c8 + 1));
                    goto LAB_00113cdf;
                  }
                }
                x[lVar13].r = local_d8.r;
                x[lVar13].i = local_d8.i;
                lVar18 = lVar18 + 0x10;
                bVar10 = (long)uVar12 < (long)*n;
                uVar12 = uVar12 + 1;
              } while (bVar10);
            }
          }
          else if (0 < *n) {
            local_40 = &x[(long)iVar19 + -1].i;
            local_48 = &a->i;
            uVar12 = 1;
            pdVar27 = (double *)0x0;
            lVar18 = 0;
            local_98 = CONCAT44(local_98._4_4_,iVar19);
            do {
              piVar11 = local_c8;
              lVar16 = (long)iVar19;
              local_80 = (double *)(lVar16 * 0x10);
              lVar13 = uVar12 - 1;
              local_d8.r = x[lVar16 + -1].r;
              local_d8.i = x[lVar16 + -1].i;
              if (cVar24 == 'T') {
                if (1 < uVar12) {
                  lVar16 = 0;
                  pdVar23 = local_40;
                  do {
                    dVar1 = *(double *)
                             ((long)local_48 + lVar16 + (long)*local_c8 * (long)pdVar27 + -8);
                    dVar2 = *(double *)((long)local_48 + lVar16 + (long)*local_c8 * (long)pdVar27);
                    local_a8.r = dVar1 * ((doublecomplex *)(pdVar23 + -1))->r - *pdVar23 * dVar2;
                    local_a8.i = dVar1 * *pdVar23 + ((doublecomplex *)(pdVar23 + -1))->r * dVar2;
                    local_d8.r = local_d8.r - local_a8.r;
                    local_d8.i = local_d8.i - local_a8.i;
                    pdVar23 = pdVar23 + (long)*incx * 2;
                    lVar16 = lVar16 + 0x10;
                    local_c0.r = local_d8.r;
                    local_c0.i = local_d8.i;
                    local_58 = lVar13;
                  } while (pdVar27 != (double *)lVar16);
                }
                uVar15 = uVar12;
                if (cVar6 == 'N') {
                  local_78 = CONCAT44(local_78._4_4_,iVar19);
                  pdVar17 = a + (int)lVar13 * (*local_c8 + 1);
LAB_001145b6:
                  z_div(&local_c0,&local_d8,pdVar17);
                  local_d8.r = local_c0.r;
                  local_d8.i = local_c0.i;
                  a = local_88;
                  n = (integer *)local_90;
                  uVar15 = uVar12;
                  iVar19 = (int)local_78;
                }
              }
              else {
                local_78 = CONCAT44(local_78._4_4_,iVar19);
                local_58 = lVar13;
                local_50 = pdVar27;
                local_38 = uVar12;
                if (1 < uVar12) {
                  lVar16 = 0;
                  iVar26 = (int)local_98;
                  do {
                    d_cnjg(&local_70,a + (long)*piVar11 * (long)(int)lVar18 + lVar16);
                    local_a8.r = local_70.r * x[(long)iVar26 + -1].r -
                                 x[(long)iVar26 + -1].i * local_70.i;
                    local_a8.i = local_70.r * x[(long)iVar26 + -1].i +
                                 x[(long)iVar26 + -1].r * local_70.i;
                    local_d8.r = local_d8.r - local_a8.r;
                    local_d8.i = local_d8.i - local_a8.i;
                    iVar26 = iVar26 + *incx;
                    lVar16 = lVar16 + 1;
                    a = local_88;
                    local_c0.r = local_d8.r;
                    local_c0.i = local_d8.i;
                  } while (lVar18 != lVar16);
                }
                uVar12 = local_38;
                pdVar27 = local_50;
                cVar24 = (char)local_60;
                n = (integer *)local_90;
                uVar15 = local_38;
                iVar19 = (int)local_78;
                if (cVar6 == 'N') {
                  d_cnjg(&local_a8,a + (int)local_58 * (*local_c8 + 1));
                  pdVar17 = &local_a8;
                  goto LAB_001145b6;
                }
              }
              *(double *)((long)&x[-1].r + (long)local_80) = local_d8.r;
              *(double *)((long)x + (long)local_80 + -8) = local_d8.i;
              iVar19 = iVar19 + *incx;
              uVar12 = uVar15 + 1;
              lVar18 = lVar18 + 1;
              pdVar27 = (double *)((long)pdVar27 + 0x10);
            } while ((long)uVar15 < (long)*n);
          }
        }
        else if (iVar26 == 1) {
          if (0 < (int)uVar7) {
            lVar18 = uVar12 << 4;
            do {
              piVar11 = local_c8;
              lVar18 = lVar18 + -0x10;
              uVar15 = uVar12 - 1;
              local_80 = (double *)(uVar15 * 0x10);
              local_d8.r = x[uVar15].r;
              local_d8.i = x[uVar15].i;
              lVar13 = (long)*n;
              if (cVar24 == 'T') {
                if ((long)uVar12 < lVar13) {
                  lVar16 = lVar13 * 0x10 + -8;
                  do {
                    lVar13 = lVar13 + -1;
                    dVar1 = *(double *)((long)a + lVar16 + *local_c8 * lVar18 + -8);
                    dVar2 = *(double *)((long)&a->r + lVar16 + *local_c8 * lVar18);
                    dVar3 = *(double *)((long)x + lVar16 + -8);
                    dVar4 = *(double *)((long)&x->r + lVar16);
                    local_a8.r = dVar1 * dVar3 - dVar4 * dVar2;
                    local_a8.i = dVar1 * dVar4 + dVar3 * dVar2;
                    local_d8.r = local_d8.r - local_a8.r;
                    local_d8.i = local_d8.i - local_a8.i;
                    lVar16 = lVar16 + -0x10;
                    local_c0.r = local_d8.r;
                    local_c0.i = local_d8.i;
                  } while ((long)uVar12 < lVar13);
                }
                if (cVar6 == 'N') {
                  local_98 = CONCAT44(local_98._4_4_,iVar25);
                  pdVar17 = a + (int)uVar15 * (*local_c8 + 1);
LAB_0011410b:
                  z_div(&local_c0,&local_d8,pdVar17);
                  local_d8.r = local_c0.r;
                  local_d8.i = local_c0.i;
                  a = local_88;
                  n = (integer *)local_90;
                  iVar25 = (int)local_98;
                }
              }
              else {
                local_98 = CONCAT44(local_98._4_4_,iVar25);
                local_78 = lVar18;
                if ((long)uVar12 < lVar13) {
                  uVar20 = (long)(*n + -1);
                  do {
                    d_cnjg(&local_70,a + (long)*piVar11 * (long)iVar25 + uVar20);
                    local_a8.r = local_70.r * x[uVar20 & 0xffffffff].r -
                                 x[uVar20 & 0xffffffff].i * local_70.i;
                    local_a8.i = local_70.r * x[uVar20 & 0xffffffff].i +
                                 x[uVar20 & 0xffffffff].r * local_70.i;
                    local_d8.r = local_d8.r - local_a8.r;
                    local_d8.i = local_d8.i - local_a8.i;
                    bVar10 = (long)uVar12 < (long)uVar20;
                    uVar20 = uVar20 - 1;
                    a = local_88;
                    local_c0.r = local_d8.r;
                    local_c0.i = local_d8.i;
                  } while (bVar10);
                }
                lVar18 = local_78;
                cVar24 = (char)local_60;
                n = (integer *)local_90;
                iVar25 = (int)local_98;
                if (cVar6 == 'N') {
                  pdVar17 = &local_a8;
                  d_cnjg(pdVar17,a + (int)uVar15 * (*local_c8 + 1));
                  goto LAB_0011410b;
                }
              }
              pdVar27 = (double *)((long)&x->r + (long)local_80);
              *pdVar27 = local_d8.r;
              pdVar27[1] = local_d8.i;
              iVar25 = iVar25 + -1;
              bVar10 = 1 < (long)uVar12;
              uVar12 = uVar15;
            } while (bVar10);
          }
        }
        else if (0 < (int)uVar7) {
          iVar19 = iVar19 + iVar26 * (uVar7 - 1);
          local_50 = &a[-1].i;
          lVar18 = uVar12 << 4;
          local_98 = CONCAT44(local_98._4_4_,iVar19);
          iVar26 = iVar19;
          do {
            piVar11 = local_c8;
            lVar18 = lVar18 + -0x10;
            lVar13 = (long)iVar19;
            local_78 = lVar13 * 0x10;
            local_d8.r = x[lVar13 + -1].r;
            local_d8.i = x[lVar13 + -1].i;
            lVar13 = (long)*n;
            local_80 = (double *)CONCAT44(local_80._4_4_,iVar19);
            if (cVar24 == 'T') {
              if ((long)uVar12 < lVar13) {
                pdVar27 = (double *)((long)local_50 + *local_c8 * lVar18 + lVar13 * 0x10);
                do {
                  lVar13 = lVar13 + -1;
                  local_a8.r = pdVar27[-1] * x[(long)iVar26 + -1].r -
                               x[(long)iVar26 + -1].i * *pdVar27;
                  local_a8.i = pdVar27[-1] * x[(long)iVar26 + -1].i +
                               x[(long)iVar26 + -1].r * *pdVar27;
                  local_d8.r = local_d8.r - local_a8.r;
                  local_d8.i = local_d8.i - local_a8.i;
                  iVar26 = iVar26 - *incx;
                  pdVar27 = pdVar27 + -2;
                  local_c0.r = local_d8.r;
                  local_c0.i = local_d8.i;
                } while ((long)uVar12 < lVar13);
              }
              if (cVar6 == 'N') {
                pdVar17 = a + ((int)uVar12 + -1) * (*local_c8 + 1);
LAB_00114a40:
                z_div(&local_c0,&local_d8,pdVar17);
                local_d8.r = local_c0.r;
                local_d8.i = local_c0.i;
                a = local_88;
                n = (integer *)local_90;
              }
            }
            else {
              local_58 = lVar18;
              if ((long)uVar12 < lVar13) {
                lVar18 = (long)(*n + -1);
                iVar26 = (int)local_98;
                do {
                  d_cnjg(&local_70,a + (long)iVar25 * (long)*piVar11 + lVar18);
                  local_a8.r = local_70.r * x[(long)iVar26 + -1].r -
                               x[(long)iVar26 + -1].i * local_70.i;
                  local_a8.i = local_70.r * x[(long)iVar26 + -1].i +
                               x[(long)iVar26 + -1].r * local_70.i;
                  local_d8.r = local_d8.r - local_a8.r;
                  local_d8.i = local_d8.i - local_a8.i;
                  iVar26 = iVar26 - *incx;
                  bVar10 = (long)uVar12 < lVar18;
                  lVar18 = lVar18 + -1;
                  a = local_88;
                  local_c0.r = local_d8.r;
                  local_c0.i = local_d8.i;
                } while (bVar10);
              }
              lVar18 = local_58;
              n = (integer *)local_90;
              if (cVar6 == 'N') {
                pdVar17 = &local_a8;
                d_cnjg(pdVar17,a + ((int)uVar12 + -1) * (*piVar11 + 1));
                goto LAB_00114a40;
              }
            }
            *(double *)((long)&x[-1].r + local_78) = local_d8.r;
            *(double *)((long)x + local_78 + -8) = local_d8.i;
            iVar19 = (int)local_80 - *incx;
            iVar25 = iVar25 + -1;
            bVar10 = 1 < (long)uVar12;
            uVar12 = uVar12 - 1;
            cVar24 = (char)local_60;
            iVar26 = (int)local_98;
          } while (bVar10);
        }
      }
    }
  }
  else {
    input_error("ZTRSV ",&local_ac);
  }
  return;
}

Assistant:

void ztrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublecomplex *a, integer *lda, doublecomplex *x, integer *incx)
{

    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void z_div(doublecomplex *, doublecomplex *, doublecomplex *), d_cnjg(
	    doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("ZTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L150: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L160: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of ZTRSV . */

}